

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
read_bigfloat(basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this
             ,string_type *str,error_code *ec)

{
  stream_source<unsigned_char> *this_00;
  pointer puVar1;
  uint8_t *puVar2;
  cbor_errc __e;
  byte bVar3;
  char_result<unsigned_char> cVar4;
  size_t sVar5;
  uint64_t value;
  uint64_t value_00;
  int64_t iVar6;
  ssize_t sVar7;
  size_t in_RCX;
  char cVar8;
  uint8_t b;
  bigint n;
  basic_bigint<std::allocator<unsigned_char>_> local_80;
  basic_bigint<std::allocator<unsigned_char>_> local_58;
  
  sVar5 = get_size(this,ec);
  if (ec->_M_value != 0) {
    return;
  }
  if (sVar5 == 2) {
    this_00 = &this->source_;
    cVar4 = stream_source<unsigned_char>::peek(this_00);
    if (((ushort)cVar4 >> 8 & 1) == 0) {
      bVar3 = cVar4.value >> 5;
      if (bVar3 == 1) {
        value = get_int64_value(this,ec);
      }
      else {
        if (bVar3 != 0) goto LAB_001ff855;
        value = get_uint64_value(this,ec);
      }
      if (ec->_M_value != 0) {
        return;
      }
      cVar4 = stream_source<unsigned_char>::peek(this_00);
      if (((ushort)cVar4 >> 8 & 1) == 0) {
        bVar3 = cVar4.value >> 5;
        cVar8 = (char)str;
        if (bVar3 != 6) {
          if (bVar3 == 1) {
            iVar6 = get_int64_value(this,ec);
            if (ec->_M_value != 0) {
              return;
            }
            std::__cxx11::string::push_back(cVar8);
            std::__cxx11::string::push_back(cVar8);
            std::__cxx11::string::push_back(cVar8);
            value_00 = -iVar6;
          }
          else {
            if (bVar3 != 0) goto LAB_001ff855;
            value_00 = get_uint64_value(this,ec);
            if (ec->_M_value != 0) {
              return;
            }
            std::__cxx11::string::push_back(cVar8);
            std::__cxx11::string::push_back(cVar8);
          }
          jsoncons::detail::integer_to_hex<unsigned_long,std::__cxx11::string>(value_00,str);
LAB_001ff8ab:
          std::__cxx11::string::push_back(cVar8);
          if ((long)value < 0) {
            std::__cxx11::string::push_back(cVar8);
            value = -value;
          }
          jsoncons::detail::integer_to_hex<unsigned_long,std::__cxx11::string>(value,str);
          return;
        }
        sVar7 = stream_source<unsigned_char>::read(this_00,(int)&n + -1,(void *)0x1,in_RCX);
        if ((sVar7 != 0) &&
           (cVar4 = stream_source<unsigned_char>::peek(this_00), ((ushort)cVar4 >> 8 & 1) == 0)) {
          if (((ushort)cVar4 & 0xe0) != 0x40) goto LAB_001ff8ab;
          puVar1 = (this->bytes_buffer_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->bytes_buffer_).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish != puVar1) {
            (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar1;
          }
          read_byte_string(this,&this->bytes_buffer_,ec);
          if (ec->_M_value == 0) {
            if ((b & 0x1f) == 3) {
              std::__cxx11::string::push_back(cVar8);
              std::__cxx11::string::push_back(cVar8);
              puVar2 = (this->bytes_buffer_).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                        (&n,1,puVar2,
                         (long)(this->bytes_buffer_).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
              local_58.field_0._0_1_ = 2;
              local_58.field_0.common_stor_.length_ = 1;
              local_58.field_0.short_stor_.values_[0] = 1;
              local_58.field_0.short_stor_.values_[1] = 0;
              operator-(&local_80,&local_58,&n);
              basic_bigint<std::allocator<unsigned_char>_>::operator=(&n,&local_80);
              basic_bigint<std::allocator<unsigned_char>_>::destroy(&local_80);
              basic_bigint<std::allocator<unsigned_char>_>::destroy(&local_58);
              basic_bigint<std::allocator<unsigned_char>>::
              write_string_hex<char,std::char_traits<char>,std::allocator<char>>
                        ((basic_bigint<std::allocator<unsigned_char>> *)&n,str);
              (str->_M_dataplus)._M_p[2] = 'x';
            }
            else {
              if ((b & 0x1f) != 2) goto LAB_001ff8ab;
              std::__cxx11::string::push_back(cVar8);
              std::__cxx11::string::push_back(cVar8);
              puVar2 = (this->bytes_buffer_).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                        ((basic_bigint<std::allocator<unsigned_char>_> *)&n,1,puVar2,
                         (long)(this->bytes_buffer_).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
              basic_bigint<std::allocator<unsigned_char>>::
              write_string_hex<char,std::char_traits<char>,std::allocator<char>>
                        ((basic_bigint<std::allocator<unsigned_char>> *)&n,str);
            }
            basic_bigint<std::allocator<unsigned_char>_>::destroy(&n);
            goto LAB_001ff8ab;
          }
          goto LAB_001ff860;
        }
      }
    }
    __e = unexpected_eof;
  }
  else {
LAB_001ff855:
    __e = invalid_bigfloat;
  }
  std::error_code::operator=(ec,__e);
LAB_001ff860:
  this->more_ = false;
  return;
}

Assistant:

void read_bigfloat(string_type& str, std::error_code& ec)
    {
        std::size_t size = get_size(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }
        if (size != 2)
        {
            ec = cbor_errc::invalid_bigfloat;
            more_ = false;
            return;
        }

        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        int64_t exponent = 0;
        switch (get_major_type(c.value))
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                exponent = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                exponent = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            default:
            {
                ec = cbor_errc::invalid_bigfloat;
                more_ = false;
                return;
            }
        }

        c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        switch (get_major_type(c.value))
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                uint64_t val = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                str.push_back('0');
                str.push_back('x');
                jsoncons::detail::integer_to_hex(val, str);
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                int64_t val = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                str.push_back('-');
                str.push_back('0');
                str.push_back('x');
                jsoncons::detail::integer_to_hex(static_cast<uint64_t>(-val), str);
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::semantic_tag:
            {
                uint8_t b;
                if (source_.read(&b, 1) == 0)
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                uint8_t tag = get_additional_information_value(b);

                c = source_.peek();
                if (JSONCONS_UNLIKELY(c.eof))
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                if (get_major_type(c.value) == jsoncons::cbor::detail::cbor_major_type::byte_string)
                {
                    bytes_buffer_.clear(); 
                    read_byte_string(bytes_buffer_, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    if (tag == 2)
                    {
                        str.push_back('0');
                        str.push_back('x');
                        bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                        n.write_string_hex(str);
                    }
                    else if (tag == 3)
                    {
                        str.push_back('-');
                        str.push_back('0');
                        bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                        n = -1 - n;
                        n.write_string_hex(str);
                        str[2] = 'x'; // overwrite minus
                    }
                }
                break;
            }
            default:
            {
                ec = cbor_errc::invalid_bigfloat;
                more_ = false;
                return;
            }
        }

        str.push_back('p');
        if (exponent >=0)
        {
            jsoncons::detail::integer_to_hex(static_cast<uint64_t>(exponent), str);
        }
        else
        {
            str.push_back('-');
            jsoncons::detail::integer_to_hex(static_cast<uint64_t>(-exponent), str);
        }
    }